

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void view_from(int srow,int scol,char **loc_cs_rows,char *left_most,char *right_most,int range,
              _func_void_int_int_void_ptr *func,void *arg)

{
  char *pcVar1;
  int iVar2;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  char *limits;
  int local_40;
  int right;
  int left;
  int nrow;
  char *rowp;
  int i;
  int range_local;
  char *right_most_local;
  char *left_most_local;
  char **loc_cs_rows_local;
  int scol_local;
  int srow_local;
  
  vis_func = func;
  varg = arg;
  if (viz_clear_rows[srow][scol] == '\0') {
    if (scol == 0) {
      local_54 = 0;
    }
    else {
      if (viz_clear_rows[srow][scol + -1] == '\0') {
        local_58 = scol + -1;
      }
      else {
        local_58 = (int)left_ptrs[srow][scol + -1];
      }
      local_54 = local_58;
    }
    local_40 = local_54;
    if (scol == 0x4f) {
      local_5c = 0x4f;
    }
    else {
      if (viz_clear_rows[srow][scol + 1] == '\0') {
        local_60 = scol + 1;
      }
      else {
        local_60 = (int)right_ptrs[srow][scol + 1];
      }
      local_5c = local_60;
    }
    limits._4_4_ = local_5c;
  }
  else {
    local_40 = (int)left_ptrs[srow][scol];
    limits._4_4_ = (int)right_ptrs[srow][scol];
  }
  start_col = scol;
  start_row = srow;
  cs_rows = loc_cs_rows;
  cs_left = left_most;
  cs_right = right_most;
  if (range == 0) {
    local_50 = (char *)0x0;
  }
  else {
    if ((0xf < range) || (range < 1)) {
      panic("view_from called with range %d",(ulong)(uint)range);
    }
    local_50 = "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
               + (long)(int)""[range] + 1;
    if (local_40 < scol - range) {
      local_40 = scol - range;
    }
    if (scol + range < limits._4_4_) {
      limits._4_4_ = scol + range;
    }
  }
  if (func == (_func_void_int_int_void_ptr *)0x0) {
    pcVar1 = loc_cs_rows[srow];
    for (rowp._0_4_ = local_40; (int)rowp <= limits._4_4_; rowp._0_4_ = (int)rowp + 1) {
      pcVar1[(int)rowp] = '\x01';
    }
    cs_left[srow] = (char)local_40;
    cs_right[srow] = (char)limits._4_4_;
  }
  else {
    for (rowp._0_4_ = local_40; (int)rowp <= limits._4_4_; rowp._0_4_ = (int)rowp + 1) {
      (*func)((int)rowp,srow,arg);
    }
  }
  iVar2 = srow + 1;
  if (iVar2 < 0x15) {
    step = 1;
    if (scol < 0x4f) {
      right_side(iVar2,scol,limits._4_4_,local_50);
    }
    if (scol != 0) {
      left_side(iVar2,local_40,scol,local_50);
    }
  }
  iVar2 = srow + -1;
  if (-1 < iVar2) {
    step = -1;
    if (scol < 0x4f) {
      right_side(iVar2,scol,limits._4_4_,local_50);
    }
    if (scol != 0) {
      left_side(iVar2,local_40,scol,local_50);
    }
  }
  return;
}

Assistant:

static void view_from(
    int  srow, int scol,/* starting row and column */
    char **loc_cs_rows,	/* pointers to the rows of the could_see array */
    char *left_most,	/* min mark on each row */
    char *right_most,	/* max mark on each row */
    int range,		/* 0 if unlimited */
    void (*func)(int,int,void *),
    void *arg)
{
    int i;		/* loop counter */
    char         *rowp;		/* optimization for setting could_see */
    int		 nrow;		/* the next row */
    int		 left;		/* the left-most visible column */
    int		 right;		/* the right-most visible column */
    const char	 *limits;	/* range limit for next row */

    /* Set globals for q?_path(), left_side(), and right_side() to use. */
    start_col = scol;
    start_row = srow;
    cs_rows   = loc_cs_rows;	/* 'could see' rows */
    cs_left   = left_most;
    cs_right  = right_most;
    vis_func = func;
    varg = arg;

    /*
     * Determine extent of sight on the starting row.
     */
    if (is_clear(srow,scol)) {
	left =  left_ptrs[srow][scol];
	right = right_ptrs[srow][scol];
    } else {
	/*
	 * When in stone, you can only see your adjacent squares, unless
	 * you are on an array boundary or a stone/clear boundary.
	 */
	left  = (!scol) ? 0 :
		(is_clear(srow,scol-1) ? left_ptrs[srow][scol-1] : scol-1);
	right = (scol == COLNO-1) ? COLNO-1 :
		(is_clear(srow,scol+1) ? right_ptrs[srow][scol+1] : scol+1);
    }

    if (range) {
	if (range > MAX_RADIUS || range < 1)
	    panic("view_from called with range %d", range);
	limits = circle_ptr(range) + 1; /* start at next row */
	if (left < scol - range) left = scol - range;
	if (right > scol + range) right = scol + range;
    } else
	limits = NULL;

    if (func) {
	for (i = left; i <= right; i++) (*func)(i, srow, arg);
    } else {
	/* Row pointer optimization. */
	rowp = cs_rows[srow];

	/* We know that we can see our row. */
	for (i = left; i <= right; i++) set_cs(rowp,i);
	cs_left[srow]  = left;
	cs_right[srow] = right;
    }

    /*
     * Check what could be seen in quadrants.  We need to check for valid
     * rows here, since we don't do it in the routines right_side() and
     * left_side() [ugliness to remove extra routine calls].
     */
    if ( (nrow = srow+1) < ROWNO ) {	/* move down */
	step =  1;
	if (scol < COLNO-1) right_side(nrow, scol, right, limits);
	if (scol)	    left_side (nrow, left,  scol, limits);
    }

    if ( (nrow = srow-1) >= 0 ) {	/* move up */
	step = -1;
	if (scol < COLNO-1) right_side(nrow, scol, right, limits);
	if (scol)	    left_side (nrow, left,  scol, limits);
    }
}